

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O1

int gauden_compute_log(float64 **den,uint32 **den_idx,vector_t *obs,gauden_t *g,uint32 mgau,
                      uint32 **prev_den_idx)

{
  uint uVar1;
  uint uVar2;
  uint32 uVar3;
  float64 *pfVar4;
  vector_t pfVar5;
  vector_t *ppfVar6;
  vector_t **pppfVar7;
  float32 *pfVar8;
  vector_t **pppfVar9;
  float32 **ppfVar10;
  uint32 *puVar11;
  vector_t *ppfVar12;
  uint32 *puVar13;
  ulong uVar14;
  float64 fVar15;
  ulong local_90;
  
  uVar1 = g->n_density;
  uVar2 = g->n_top;
  if (uVar1 < uVar2) {
    __assert_fail("g->n_top <= g->n_density",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                  ,0x4c7,
                  "int gauden_compute_log(float64 **, uint32 **, vector_t *, gauden_t *, uint32, uint32 **)"
                 );
  }
  if (g->fullvar == (vector_t ****)0x0) {
    if (uVar2 == uVar1) {
      if (g->n_feat != 0) {
        puVar13 = g->veclen;
        pppfVar7 = g->mean[mgau];
        pppfVar9 = g->var[mgau];
        ppfVar10 = g->norm[mgau];
        local_90 = 0;
        do {
          uVar1 = g->n_density;
          if ((ulong)uVar1 != 0) {
            pfVar4 = den[local_90];
            puVar11 = den_idx[local_90];
            uVar3 = puVar13[local_90];
            pfVar5 = obs[local_90];
            ppfVar6 = pppfVar7[local_90];
            ppfVar12 = pppfVar9[local_90];
            pfVar8 = ppfVar10[local_90];
            uVar14 = 0;
            do {
              fVar15 = log_diag_eval(pfVar5,pfVar8[uVar14],ppfVar6[uVar14],ppfVar12[uVar14],uVar3);
              pfVar4[uVar14] = fVar15;
              puVar11[uVar14] = (uint32)uVar14;
              uVar14 = uVar14 + 1;
            } while (uVar1 != uVar14);
          }
          local_90 = local_90 + 1;
        } while (local_90 < g->n_feat);
      }
    }
    else {
      if (uVar1 <= uVar2) {
        __assert_fail("g->n_top < g->n_density",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                      ,0x4e4,
                      "int gauden_compute_log(float64 **, uint32 **, vector_t *, gauden_t *, uint32, uint32 **)"
                     );
      }
      if (g->n_feat != 0) {
        uVar14 = 0;
        do {
          if (prev_den_idx == (uint32 **)0x0) {
            puVar13 = (uint32 *)0x0;
          }
          else {
            puVar13 = prev_den_idx[uVar14];
          }
          log_topn_densities(den[uVar14],den_idx[uVar14],g->n_top,g->n_density,g->veclen[uVar14],
                             obs[uVar14],g->mean[mgau][uVar14],g->var[mgau][uVar14],
                             g->norm[mgau][uVar14],puVar13);
          uVar14 = uVar14 + 1;
        } while (uVar14 < g->n_feat);
      }
    }
  }
  else {
    if (uVar2 != uVar1) {
      __assert_fail("g->n_top == g->n_density",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                    ,0x4cb,
                    "int gauden_compute_log(float64 **, uint32 **, vector_t *, gauden_t *, uint32, uint32 **)"
                   );
    }
    if (g->n_feat != 0) {
      local_90 = 0;
      do {
        uVar1 = g->n_density;
        if ((ulong)uVar1 != 0) {
          pfVar4 = den[local_90];
          puVar13 = den_idx[local_90];
          uVar3 = g->veclen[local_90];
          pfVar5 = obs[local_90];
          ppfVar6 = g->mean[mgau][local_90];
          pppfVar7 = g->fullvar[mgau][local_90];
          pfVar8 = g->norm[mgau][local_90];
          uVar14 = 0;
          do {
            fVar15 = log_full_eval(pfVar5,pfVar8[uVar14],ppfVar6[uVar14],pppfVar7[uVar14],uVar3);
            pfVar4[uVar14] = fVar15;
            puVar13[uVar14] = (uint32)uVar14;
            uVar14 = uVar14 + 1;
          } while (uVar1 != uVar14);
        }
        local_90 = local_90 + 1;
      } while (local_90 < g->n_feat);
    }
  }
  return 0;
}

Assistant:

int
gauden_compute_log(float64 **den,		/* density array for a mixture Gaussian */
		   uint32 **den_idx,	/* density index array for n_top < n_density eval */
		   vector_t *obs,		/* observation vector for some time */
		   gauden_t *g,		/* Gaussian density structure */
		   uint32 mgau,		/* id of the mixture Gau. to evaluate */
		   uint32 **prev_den_idx)   /* Previous frame's top N densities (or NULL) */
{
    uint32 j;

    /* make sure this is true at initialization time */
    assert(g->n_top <= g->n_density);

    /* Top-N computation not (yet) possible for full covariances */
    if (g->fullvar) {
	assert(g->n_top == g->n_density);
	for (j = 0; j < g->n_feat; j++) {
	    log_full_densities_full(den[j],
			       den_idx[j],
			       g->n_density,
			       g->veclen[j],
			       obs[j],
			       g->mean[mgau][j],
			       g->fullvar[mgau][j],
			       g->norm[mgau][j]);
	}
    }
    else if (g->n_top == g->n_density) {
	for (j = 0; j < g->n_feat; j++) {
	    log_full_densities(den[j],
			       den_idx[j],
			       g->n_density,
			       g->veclen[j],
			       obs[j],
			       g->mean[mgau][j],
			       g->var[mgau][j],
			       g->norm[mgau][j]);
	}
    }
    else {
	assert(g->n_top < g->n_density);

	for (j = 0; j < g->n_feat; j++) {
	    log_topn_densities(den[j],
			       den_idx[j],
			       g->n_top,
			       g->n_density,
			       g->veclen[j],
			       obs[j],
			       g->mean[mgau][j],
			       g->var[mgau][j],
			       g->norm[mgau][j],
			       prev_den_idx ? prev_den_idx[j] : NULL);
	}
    }


#ifdef GAUDEN_VERBOSE
    gauden_print(stdout,
		 den, den_idx, g,
		 global_map, n_global_map);
#endif

    return S3_SUCCESS;
}